

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bijective_hash.hpp
# Opt level: O0

void __thiscall
poplar::bijective_hash::split_mix_hasher::show_stats(split_mix_hasher *this,ostream *os,int n)

{
  ostream *os_00;
  char *k;
  string *in_RSI;
  string indent;
  char (*in_stack_ffffffffffffff78) [17];
  char *in_stack_ffffffffffffff80;
  string *in_stack_ffffffffffffff88;
  string *indent_00;
  ostream *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffffa8;
  string local_38 [40];
  string *local_10;
  
  local_10 = in_RSI;
  get_indent_abi_cxx11_((int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
  show_stat<char[17]>(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                      in_stack_ffffffffffffff78);
  indent_00 = local_10;
  os_00 = (ostream *)size((split_mix_hasher *)0x214dbb);
  show_stat<unsigned_long>
            (os_00,indent_00,in_stack_ffffffffffffff80,(unsigned_long *)in_stack_ffffffffffffff78);
  k = (char *)bits((split_mix_hasher *)0x214dfc);
  show_stat<unsigned_long>(os_00,indent_00,k,(unsigned_long *)local_10);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void show_stats(std::ostream& os, int n = 0) const {
        auto indent = get_indent(n);
        show_stat(os, indent, "name", "split_mix_hasher");
        show_stat(os, indent, "size", size());
        show_stat(os, indent, "bits", bits());
    }